

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::Context::Context
          (Context *this,TestContext *testCtx,RenderContext *renderCtx,CheckerFactory *factory)

{
  FormatExtEntries extRange;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = renderCtx;
  FboUtil::FormatDB::FormatDB(&this->m_coreFormats);
  FboUtil::FormatDB::FormatDB(&this->m_ctxFormats);
  FboUtil::FormatDB::FormatDB(&this->m_allFormats);
  FboUtil::FboVerifier::FboVerifier(&this->m_verifier,&this->m_ctxFormats,factory,renderCtx);
  this->m_haveMultiColorAtts = false;
  extRange.m_end = (FormatExtEntry *)createRenderableTests::attPoints;
  extRange.m_begin = (FormatExtEntry *)s_esExtFormats;
  addExtFormats(this,extRange);
  return;
}

Assistant:

Context::Context (TestContext& testCtx,
				  RenderContext& renderCtx,
				  CheckerFactory& factory)
	: m_testCtx				(testCtx)
	, m_renderCtx			(renderCtx)
	, m_verifier			(m_ctxFormats, factory, renderCtx)
	, m_haveMultiColorAtts	(false)
{
	FormatExtEntries extRange = GLS_ARRAY_RANGE(s_esExtFormats);
	addExtFormats(extRange);
}